

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSharedLibrary.cpp
# Opt level: O1

void * __thiscall
MinVR::VRSharedLibrary::loadSymbolInternal(VRSharedLibrary *this,string *functionName)

{
  void *pvVar1;
  long lVar2;
  
  if (this->_isLoaded == true) {
    pvVar1 = (void *)dlsym(this->_lib,(functionName->_M_dataplus)._M_p);
    lVar2 = dlerror();
    if (lVar2 == 0) {
      return pvVar1;
    }
    dlerror();
  }
  return (void *)0x0;
}

Assistant:

void* VRSharedLibrary::loadSymbolInternal(const std::string &functionName) {
	if (_isLoaded)
	{
#if defined(WIN32)
		FARPROC symbol =GetProcAddress(_lib, functionName.c_str());
		if (!symbol) {
			//MinVR::Logger::getInstance().assertMessage(false, "Cannot load symbol: " + functionName + " - " + "");

			return NULL;
		}

		return symbol;
#else
		void* symbol = (void*) dlsym(_lib, functionName.c_str());
		const char* dlsym_error = dlerror();
		if (dlsym_error) {
			//MinVR::Logger::getInstance().assertMessage(false, "Cannot load symbol: " + functionName + " - " + dlsym_error);
			dlerror();

			return NULL;
		}

		return symbol;
#endif

	}

	return NULL;
}